

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall
IRBuilder::InsertBailOutForDebugger
          (IRBuilder *this,uint byteCodeOffset,BailOutKind kind,Instr *insertBeforeInstr)

{
  code *pcVar1;
  bool bVar2;
  uint32 offset;
  undefined4 *puVar3;
  JitArenaAllocator *pJVar4;
  BailOutInfo *this_00;
  BailOutInstrTemplate<IR::Instr> *instr_00;
  BailOutInstr *instr;
  TrackAllocData local_50;
  BailOutInfo *local_28;
  BailOutInfo *bailOutInfo;
  Instr *insertBeforeInstr_local;
  BailOutKind kind_local;
  uint byteCodeOffset_local;
  IRBuilder *this_local;
  
  bailOutInfo = (BailOutInfo *)insertBeforeInstr;
  insertBeforeInstr_local._0_4_ = kind;
  insertBeforeInstr_local._4_4_ = byteCodeOffset;
  _kind_local = this;
  bVar2 = Func::IsJitInDebugMode(this->m_func);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x43,"(m_func->IsJitInDebugMode())","m_func->IsJitInDebugMode()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (insertBeforeInstr_local._4_4_ == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x44,"(byteCodeOffset != Js::Constants::NoByteCodeOffset)",
                       "byteCodeOffset != Js::Constants::NoByteCodeOffset");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pJVar4 = this->m_func->m_alloc;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&BailOutInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
             ,0x46);
  pJVar4 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar4,&local_50);
  this_00 = (BailOutInfo *)new<Memory::JitArenaAllocator>(0xb8,pJVar4,0x4e98c0);
  BailOutInfo::BailOutInfo(this_00,insertBeforeInstr_local._4_4_,this->m_func);
  local_28 = this_00;
  instr_00 = IR::BailOutInstrTemplate<IR::Instr>::New
                       (BailForDebugger,(BailOutKind)insertBeforeInstr_local,this_00,
                        this_00->bailOutFunc);
  if (bailOutInfo == (BailOutInfo *)0x0) {
    offset = IR::Instr::GetByteCodeOffset(this->m_lastInstr);
    AddInstr(this,&instr_00->super_Instr,offset);
  }
  else {
    InsertInstr(this,&instr_00->super_Instr,(Instr *)bailOutInfo);
  }
  return;
}

Assistant:

void
IRBuilder::InsertBailOutForDebugger(uint byteCodeOffset, IR::BailOutKind kind, IR::Instr* insertBeforeInstr /* default nullptr */)
{
    Assert(m_func->IsJitInDebugMode());
    Assert(byteCodeOffset != Js::Constants::NoByteCodeOffset);

    BailOutInfo * bailOutInfo = JitAnew(m_func->m_alloc, BailOutInfo, byteCodeOffset, m_func);
    IR::BailOutInstr * instr = IR::BailOutInstr::New(Js::OpCode::BailForDebugger, kind, bailOutInfo, bailOutInfo->bailOutFunc);
    if (insertBeforeInstr)
    {
        InsertInstr(instr, insertBeforeInstr);
    }
    else
    {
        this->AddInstr(instr, m_lastInstr->GetByteCodeOffset());
    }
}